

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.h
# Opt level: O0

int av1_check_newmv_joint_nonzero(AV1_COMMON *cm,MACROBLOCK *x)

{
  char cVar1;
  int_mv iVar2;
  int_mv iVar3;
  long in_RSI;
  int_mv ref_mv_0_2;
  int_mv ref_mv_0_1;
  int_mv ref_mv_1_1;
  int_mv ref_mv_1;
  int_mv ref_mv_0;
  PREDICTION_MODE this_mode;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined3 in_stack_ffffffffffffffd4;
  int ref_idx;
  MACROBLOCK *x_00;
  
  x_00 = (MACROBLOCK *)**(undefined8 **)(in_RSI + 0x2058);
  cVar1 = *(char *)((long)&x_00->plane[0].src_diff + 2);
  ref_idx = CONCAT13(cVar1,in_stack_ffffffffffffffd4);
  if (cVar1 == '\x18') {
    iVar2 = av1_get_ref_mv(x_00,ref_idx);
    iVar3 = av1_get_ref_mv(x_00,ref_idx);
    if ((*(uint32_t *)&x_00->plane[0].dqcoeff == iVar2.as_int) ||
       (*(uint32_t *)((long)&x_00->plane[0].dqcoeff + 4) == iVar3.as_int)) {
      return 0;
    }
  }
  else if ((cVar1 == '\x13') || (cVar1 == '\x15')) {
    iVar2 = av1_get_ref_mv(x_00,ref_idx);
    if (*(uint32_t *)((long)&x_00->plane[0].dqcoeff + 4) == iVar2.as_int) {
      return 0;
    }
  }
  else if ((cVar1 == '\x14') || (cVar1 == '\x16')) {
    iVar2 = av1_get_ref_mv(x_00,ref_idx);
    if (*(uint32_t *)&x_00->plane[0].dqcoeff == iVar2.as_int) {
      return 0;
    }
  }
  else if ((cVar1 == '\x10') &&
          (iVar2 = av1_get_ref_mv(x_00,ref_idx),
          *(uint32_t *)&x_00->plane[0].dqcoeff == iVar2.as_int)) {
    return 0;
  }
  return 1;
}

Assistant:

static inline int av1_check_newmv_joint_nonzero(const AV1_COMMON *cm,
                                                MACROBLOCK *const x) {
  (void)cm;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const PREDICTION_MODE this_mode = mbmi->mode;
  if (this_mode == NEW_NEWMV) {
    const int_mv ref_mv_0 = av1_get_ref_mv(x, 0);
    const int_mv ref_mv_1 = av1_get_ref_mv(x, 1);
    if (mbmi->mv[0].as_int == ref_mv_0.as_int ||
        mbmi->mv[1].as_int == ref_mv_1.as_int) {
      return 0;
    }
  } else if (this_mode == NEAREST_NEWMV || this_mode == NEAR_NEWMV) {
    const int_mv ref_mv_1 = av1_get_ref_mv(x, 1);
    if (mbmi->mv[1].as_int == ref_mv_1.as_int) {
      return 0;
    }
  } else if (this_mode == NEW_NEARESTMV || this_mode == NEW_NEARMV) {
    const int_mv ref_mv_0 = av1_get_ref_mv(x, 0);
    if (mbmi->mv[0].as_int == ref_mv_0.as_int) {
      return 0;
    }
  } else if (this_mode == NEWMV) {
    const int_mv ref_mv_0 = av1_get_ref_mv(x, 0);
    if (mbmi->mv[0].as_int == ref_mv_0.as_int) {
      return 0;
    }
  }
  return 1;
}